

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::ClockingAssertionExpr::fromSyntax
          (SignalEventExpressionSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  int iVar1;
  ClockingAssertionExpr *pCVar2;
  undefined4 extraout_var;
  InvalidAssertionExpr *args_1;
  socklen_t __len;
  SourceRange sourceRange;
  ASTContext local_58;
  
  this = ((context->scope).ptr)->compilation;
  if (((context->flags).m_bits & 0x40000) == 0) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x270008,sourceRange);
    local_58.scope.ptr = (Scope *)0x0;
    pCVar2 = (ClockingAssertionExpr *)
             BumpAllocator::
             emplace<slang::ast::InvalidAssertionExpr,slang::ast::AssertionExpr_const*&>
                       (&this->super_BumpAllocator,(AssertionExpr **)&local_58);
  }
  else {
    ASTContext::resetFlags(&local_58,context,(bitmask<slang::ast::ASTFlags>)0x20);
    iVar1 = TimingControl::bind((int)syntax,(sockaddr *)&local_58,__len);
    local_58.scope.ptr = (Scope *)0x0;
    args_1 = BumpAllocator::
             emplace<slang::ast::InvalidAssertionExpr,slang::ast::AssertionExpr_const*&>
                       (&this->super_BumpAllocator,(AssertionExpr **)&local_58);
    pCVar2 = BumpAllocator::
             emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr&>
                       (&this->super_BumpAllocator,(TimingControl *)CONCAT44(extraout_var,iVar1),
                        &args_1->super_AssertionExpr);
  }
  return &pCVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& ClockingAssertionExpr::fromSyntax(const SignalEventExpressionSyntax& syntax,
                                                 const ASTContext& context) {
    // If we are creating an argument then assume it's possible it could be used in an
    // event expression and allow this. Actual usage later on will report an error if
    // this ends up not being true. Otherwise this is just an error.
    auto& comp = context.getCompilation();
    if (!context.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
        context.addDiag(diag::InvalidSignalEventInSeq, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    auto& clocking = TimingControl::bind(syntax, context.resetFlags(ASTFlags::NonProcedural));
    return *comp.emplace<ClockingAssertionExpr>(clocking, badExpr(comp, nullptr));
}